

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::MarkLabel(ByteCodeWriter *this,ByteCodeLabel labelID)

{
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00;
  code *pcVar1;
  ByteCodeLabel index;
  bool bVar2;
  Type *pTVar3;
  undefined4 *puVar4;
  uint local_18;
  ByteCodeLabel local_14;
  ByteCodeWriter *pBStack_10;
  ByteCodeLabel labelID_local;
  ByteCodeWriter *this_local;
  
  local_14 = labelID;
  pBStack_10 = this;
  CheckOpen(this);
  CheckLabel(this,local_14);
  if ((this->useBranchIsland & 1U) != 0) {
    EnsureLongBranch(this,Label);
  }
  pTVar3 = JsUtil::
           List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item(this->m_labelOffsets,local_14);
  if (*pTVar3 != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xa88,"(m_labelOffsets->Item(labelID) == 0xffffffff)",
                                "A label may only be defined at one location");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  index = local_14;
  this_00 = this->m_labelOffsets;
  local_18 = Data::GetCurrentOffset(&this->m_byteCodeData);
  JsUtil::List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  SetExistingItem(this_00,index,&local_18);
  return;
}

Assistant:

void ByteCodeWriter::MarkLabel(ByteCodeLabel labelID)
    {
        CheckOpen();
        CheckLabel(labelID);

#ifdef BYTECODE_BRANCH_ISLAND
        if (useBranchIsland)
        {
            // If we are going to emit a branch island, it should be before the label.
            EnsureLongBranch(Js::OpCode::Label);
        }
#endif
        //
        // Define the label as the current offset within the byte-code.
        //

        AssertMsg(m_labelOffsets->Item(labelID) == UINT_MAX, "A label may only be defined at one location");
        m_labelOffsets->SetExistingItem(labelID, m_byteCodeData.GetCurrentOffset());
    }